

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::ProcessOrEnqueue
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,S2CellId id)

{
  S2ClosestEdgeQueryBase<S2MinDistance> *id_00;
  bool bVar1;
  ostream *poVar2;
  S2CellId x;
  S2ShapeIndexCell *index_cell;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  uint64 local_20;
  S2ClosestEdgeQueryBase<S2MinDistance> *local_18;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  S2CellId id_local;
  
  local_18 = this;
  this_local = (S2ClosestEdgeQueryBase<S2MinDistance> *)id.id_;
  local_20 = (uint64)S2ShapeIndex::Iterator::id(&this->iter_);
  bVar1 = S2CellId::contains((S2CellId *)&this_local,(S2CellId)local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    x = S2ShapeIndex::Iterator::id(&this->iter_);
    bVar1 = ::operator==(x,(S2CellId)this_local);
    id_00 = this_local;
    if (bVar1) {
      index_cell = S2ShapeIndex::Iterator::cell(&this->iter_);
      ProcessOrEnqueue(this,(S2CellId)id_00,index_cell);
    }
    else {
      ProcessOrEnqueue(this,(S2CellId)this_local,(S2ShapeIndexCell *)0x0);
    }
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
             ,0x38a,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_38);
  poVar2 = std::operator<<(poVar2,"Check failed: id.contains(iter_.id()) ");
  S2LogMessageVoidify::operator&(&local_21,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

inline void S2ClosestEdgeQueryBase<Distance>::ProcessOrEnqueue(
    S2CellId id) {
  S2_DCHECK(id.contains(iter_.id()));
  if (iter_.id() == id) {
    ProcessOrEnqueue(id, &iter_.cell());
  } else {
    ProcessOrEnqueue(id, nullptr);
  }
}